

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

idx_t __thiscall
duckdb::CSVErrorHandler::GetLine(CSVErrorHandler *this,LinesPerBoundary *error_info)

{
  idx_t iVar1;
  
  ::std::mutex::lock(&this->main_mutex);
  iVar1 = GetLineInternal(this,error_info);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return iVar1;
}

Assistant:

idx_t CSVErrorHandler::GetLine(const LinesPerBoundary &error_info) {
	lock_guard<mutex> parallel_lock(main_mutex);
	return GetLineInternal(error_info);
}